

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Cues::LoadCuePoint(Cues *this)

{
  CuePoint *this_00;
  bool bVar1;
  longlong lVar2;
  longlong lVar3;
  CuePoint *pCP;
  longlong size;
  longlong id;
  long len;
  longlong idpos;
  IMkvReader *pReader;
  longlong stop;
  Cues *this_local;
  
  pReader = (IMkvReader *)(this->m_start + this->m_size);
  if (this->m_pos < (long)pReader) {
    stop = (longlong)this;
    bVar1 = Init(this);
    if (bVar1) {
      idpos = (longlong)this->m_pSegment->m_pReader;
      do {
        if ((long)pReader <= this->m_pos) {
          return false;
        }
        len = this->m_pos;
        lVar2 = ReadID((IMkvReader *)idpos,this->m_pos,&id);
        if ((lVar2 < 0) || ((long)pReader < this->m_pos + id)) {
          return false;
        }
        this->m_pos = id + this->m_pos;
        lVar3 = ReadUInt((IMkvReader *)idpos,this->m_pos,&id);
        if ((lVar3 < 0) || ((long)pReader < this->m_pos + id)) {
          return false;
        }
        this->m_pos = id + this->m_pos;
        if ((long)pReader < this->m_pos + lVar3) {
          return false;
        }
        if (lVar2 == 0xbb) {
          if (this->m_preload_count < 1) {
            return false;
          }
          this_00 = this->m_cue_points[this->m_count];
          if ((this_00 == (CuePoint *)0x0) ||
             ((lVar2 = CuePoint::GetTimeCode(this_00), lVar2 < 0 &&
              (lVar2 = CuePoint::GetTimeCode(this_00), -lVar2 != len)))) {
            return false;
          }
          bVar1 = CuePoint::Load(this_00,(IMkvReader *)idpos);
          if (!bVar1) {
            this->m_pos = (longlong)pReader;
            return false;
          }
          this->m_count = this->m_count + 1;
          this->m_preload_count = this->m_preload_count + -1;
          this->m_pos = lVar3 + this->m_pos;
          if (this->m_pos <= (long)pReader) {
            return true;
          }
          return false;
        }
        this->m_pos = lVar3 + this->m_pos;
      } while (this->m_pos <= (long)pReader);
    }
    else {
      this->m_pos = (longlong)pReader;
    }
  }
  return false;
}

Assistant:

bool Cues::LoadCuePoint() const {
  const long long stop = m_start + m_size;

  if (m_pos >= stop)
    return false;  // nothing else to do

  if (!Init()) {
    m_pos = stop;
    return false;
  }

  IMkvReader* const pReader = m_pSegment->m_pReader;

  while (m_pos < stop) {
    const long long idpos = m_pos;

    long len;

    const long long id = ReadID(pReader, m_pos, len);
    if (id < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume ID

    const long long size = ReadUInt(pReader, m_pos, len);
    if (size < 0 || (m_pos + len) > stop)
      return false;

    m_pos += len;  // consume Size field
    if ((m_pos + size) > stop)
      return false;

    if (id != libwebm::kMkvCuePoint) {
      m_pos += size;  // consume payload
      if (m_pos > stop)
        return false;

      continue;
    }

    if (m_preload_count < 1)
      return false;

    CuePoint* const pCP = m_cue_points[m_count];
    if (!pCP || (pCP->GetTimeCode() < 0 && (-pCP->GetTimeCode() != idpos)))
      return false;

    if (!pCP->Load(pReader)) {
      m_pos = stop;
      return false;
    }
    ++m_count;
    --m_preload_count;

    m_pos += size;  // consume payload
    if (m_pos > stop)
      return false;

    return true;  // yes, we loaded a cue point
  }

  return false;  // no, we did not load a cue point
}